

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zher2.c
# Opt level: O1

int zher2_(char *uplo,integer *n,doublecomplex *alpha,doublecomplex *x,integer *incx,
          doublecomplex *y,integer *incy,doublecomplex *a,integer *lda)

{
  doublecomplex *pdVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  double *pdVar17;
  doublecomplex *z;
  double *pdVar18;
  ulong uVar19;
  int unaff_R14D;
  long lVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  integer info;
  doublecomplex local_b8;
  doublecomplex local_a8;
  int local_94;
  doublecomplex *local_90;
  double *local_88;
  double local_80;
  double local_78;
  doublecomplex *local_70;
  uint *local_68;
  doublecomplex *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double local_40;
  int *local_38;
  
  local_94 = 0;
  cVar4 = *uplo;
  if ((cVar4 == 'L') || (cVar4 == 'U')) {
    iVar14 = *n;
    if (iVar14 < 0) {
      local_94 = 2;
    }
    else if (*incx == 0) {
      local_94 = 5;
    }
    else if (*incy == 0) {
      local_94 = 7;
    }
    else {
      iVar16 = 1;
      if (1 < iVar14) {
        iVar16 = iVar14;
      }
      if (*lda < iVar16) {
        local_94 = 9;
      }
    }
  }
  else {
    local_94 = 1;
  }
  local_90 = x;
  local_70 = alpha;
  if (local_94 == 0) {
    if ((*n != 0) &&
       ((((alpha->r != 0.0 || (NAN(alpha->r))) || (alpha->i != 0.0)) || (NAN(alpha->i))))) {
      iVar14 = *incx;
      if ((iVar14 != 1) || (*incy != 1)) {
        iVar16 = *n + -1;
        unaff_R14D = 1 - iVar14 * iVar16;
        if (0 < iVar14) {
          unaff_R14D = 1;
        }
        if (*incy < 1) {
          uplo = (char *)(ulong)(1 - *incy * iVar16);
        }
        else {
          uplo = (char *)0x1;
        }
      }
      local_68 = (uint *)n;
      local_60 = y;
      if (cVar4 == 'U') {
        if ((iVar14 == 1) && (*incy == 1)) {
          if (0 < *n) {
            local_88 = &a->i;
            lVar20 = 0;
            uVar19 = 1;
            do {
              lVar11 = uVar19 - 1;
              pdVar1 = local_90 + lVar11;
              if (((local_90[lVar11].r != 0.0) || (NAN(local_90[lVar11].r))) ||
                 ((pdVar1->i != 0.0 ||
                  ((((NAN(pdVar1->i) || (y[lVar11].r != 0.0)) || (NAN(y[lVar11].r))) ||
                   ((y[lVar11].i != 0.0 || (NAN(y[lVar11].i))))))))) {
                z = y + lVar11;
                d_cnjg(&local_b8,z);
                dVar22 = local_70->r;
                dVar2 = local_70->i;
                local_a8.r = dVar22 * local_b8.r - local_b8.i * dVar2;
                local_a8.i = local_b8.i * dVar22 + local_b8.r * dVar2;
                local_b8.r = dVar22 * pdVar1->r - pdVar1->i * dVar2;
                local_b8.i = dVar22 * pdVar1->i + dVar2 * pdVar1->r;
                local_80 = local_a8.i;
                local_78 = local_a8.r;
                d_cnjg(&local_a8,&local_b8);
                if (1 < uVar19) {
                  lVar10 = *lda * lVar20;
                  lVar15 = 0;
                  do {
                    dVar22 = *(double *)((long)&local_90->r + lVar15);
                    dVar2 = *(double *)((long)&local_90->i + lVar15);
                    dVar23 = *(double *)((long)&local_60->r + lVar15);
                    dVar3 = *(double *)((long)&local_60->i + lVar15);
                    *(double *)((long)local_88 + lVar15 + lVar10 + -8) =
                         (dVar23 * local_a8.r - local_a8.i * dVar3) +
                         (dVar22 * local_78 - local_80 * dVar2) +
                         *(double *)((long)local_88 + lVar15 + lVar10 + -8);
                    *(double *)((long)local_88 + lVar15 + lVar10) =
                         dVar23 * local_a8.i + dVar3 * local_a8.r +
                         dVar22 * local_80 + dVar2 * local_78 +
                         *(double *)((long)local_88 + lVar15 + lVar10);
                    lVar15 = lVar15 + 0x10;
                  } while (lVar20 != lVar15);
                }
                local_b8.r = pdVar1->r * local_78 - local_80 * pdVar1->i;
                local_b8.i = pdVar1->r * local_80 + local_78 * pdVar1->i;
                dVar22 = local_a8.r * z->i;
                local_a8.r = (z->r * local_a8.r - local_a8.i * z->i) + local_b8.r;
                local_a8.i = z->r * local_a8.i + dVar22 + local_b8.i;
                lVar11 = (long)((int)lVar11 * (*lda + 1));
                a[lVar11].r = local_a8.r + a[lVar11].r;
                n = (integer *)local_68;
                y = local_60;
              }
              else {
                lVar11 = (long)((int)lVar11 * (*lda + 1));
              }
              a[lVar11].i = 0.0;
              lVar20 = lVar20 + 0x10;
              bVar9 = (long)uVar19 < (long)*n;
              uVar19 = uVar19 + 1;
            } while (bVar9);
          }
        }
        else if (0 < *n) {
          local_48 = &a->i;
          local_50 = &x[(long)unaff_R14D + -1].i;
          local_58 = &y[(long)(int)uplo + -1].i;
          lVar20 = 0;
          uVar19 = 1;
          do {
            pdVar1 = local_90;
            iVar14 = (int)uplo;
            if ((((local_90[(long)unaff_R14D + -1].r != 0.0) ||
                 (NAN(local_90[(long)unaff_R14D + -1].r))) ||
                (local_90[(long)unaff_R14D + -1].i != 0.0)) ||
               (NAN(local_90[(long)unaff_R14D + -1].i))) {
LAB_00123851:
              local_78 = (double)CONCAT44(local_78._4_4_,iVar14);
              local_80 = (double)CONCAT44(local_80._4_4_,unaff_R14D);
              d_cnjg(&local_b8,y + (long)iVar14 + -1);
              dVar22 = local_70->r;
              dVar2 = local_70->i;
              local_a8.r = dVar22 * local_b8.r - local_b8.i * dVar2;
              local_a8.i = local_b8.i * dVar22 + local_b8.r * dVar2;
              local_b8.r = dVar22 * pdVar1[(long)unaff_R14D + -1].r -
                           pdVar1[(long)unaff_R14D + -1].i * dVar2;
              local_b8.i = dVar22 * pdVar1[(long)unaff_R14D + -1].i +
                           dVar2 * pdVar1[(long)unaff_R14D + -1].r;
              local_88 = (double *)local_a8.r;
              local_40 = local_a8.i;
              d_cnjg(&local_a8,&local_b8);
              if (1 < uVar19) {
                iVar16 = *incx;
                iVar6 = *incy;
                lVar11 = *lda * lVar20;
                lVar10 = 0;
                pdVar17 = local_58;
                pdVar18 = local_50;
                do {
                  dVar22 = ((doublecomplex *)(pdVar18 + -1))->r;
                  dVar2 = *pdVar18;
                  dVar23 = ((doublecomplex *)(pdVar17 + -1))->r;
                  dVar3 = *pdVar17;
                  *(double *)((long)local_48 + lVar10 + lVar11 + -8) =
                       (dVar23 * local_a8.r - local_a8.i * dVar3) +
                       (dVar22 * (double)local_88 - local_40 * dVar2) +
                       *(double *)((long)local_48 + lVar10 + lVar11 + -8);
                  *(double *)((long)local_48 + lVar10 + lVar11) =
                       dVar23 * local_a8.i + dVar3 * local_a8.r +
                       dVar22 * local_40 + dVar2 * (double)local_88 +
                       *(double *)((long)local_48 + lVar10 + lVar11);
                  lVar10 = lVar10 + 0x10;
                  pdVar18 = pdVar18 + (long)iVar16 * 2;
                  pdVar17 = pdVar17 + (long)iVar6 * 2;
                } while (lVar20 != lVar10);
              }
              local_b8.r = pdVar1[(long)unaff_R14D + -1].r * (double)local_88 -
                           local_40 * pdVar1[(long)unaff_R14D + -1].i;
              local_b8.i = pdVar1[(long)unaff_R14D + -1].r * local_40 +
                           (double)local_88 * pdVar1[(long)unaff_R14D + -1].i;
              dVar22 = local_a8.r * local_60[(long)iVar14 + -1].i;
              local_a8.r = (local_60[(long)iVar14 + -1].r * local_a8.r -
                           local_a8.i * local_60[(long)iVar14 + -1].i) + local_b8.r;
              local_a8.i = local_60[(long)iVar14 + -1].r * local_a8.i + dVar22 + local_b8.i;
              lVar11 = (long)(((int)uVar19 + -1) * (*lda + 1));
              a[lVar11].r = local_a8.r + a[lVar11].r;
              n = (integer *)local_68;
              y = local_60;
              unaff_R14D = local_80._0_4_;
              iVar14 = local_78._0_4_;
            }
            else {
              if (((y[(long)iVar14 + -1].r != 0.0) || (NAN(y[(long)iVar14 + -1].r))) ||
                 ((y[(long)iVar14 + -1].i != 0.0 || (NAN(y[(long)iVar14 + -1].i)))))
              goto LAB_00123851;
              lVar11 = (long)(((int)uVar19 + -1) * (*lda + 1));
            }
            a[lVar11].i = 0.0;
            unaff_R14D = unaff_R14D + *incx;
            uplo = (char *)(ulong)(uint)(iVar14 + *incy);
            lVar20 = lVar20 + 0x10;
            bVar9 = (long)uVar19 < (long)*n;
            uVar19 = uVar19 + 1;
          } while (bVar9);
        }
      }
      else if ((iVar14 == 1) && (*incy == 1)) {
        if (0 < *n) {
          local_88 = &a->i;
          lVar11 = 0x10;
          lVar10 = 0;
          lVar20 = 1;
          do {
            lVar15 = lVar20 + -1;
            pdVar1 = local_90 + lVar15;
            if (((local_90[lVar15].r != 0.0) || (NAN(local_90[lVar15].r))) ||
               (((pdVar1->i != 0.0 ||
                 (((NAN(pdVar1->i) || (y[lVar15].r != 0.0)) || (NAN(y[lVar15].r))))) ||
                ((y[lVar15].i != 0.0 || (NAN(y[lVar15].i))))))) {
              d_cnjg(&local_b8,y + lVar15);
              dVar22 = local_70->r;
              dVar2 = local_70->i;
              local_a8.r = dVar22 * local_b8.r - local_b8.i * dVar2;
              local_a8.i = local_b8.i * dVar22 + local_b8.r * dVar2;
              local_b8.r = dVar22 * pdVar1->r - pdVar1->i * dVar2;
              local_b8.i = dVar22 * pdVar1->i + dVar2 * pdVar1->r;
              local_80 = local_a8.i;
              local_78 = local_a8.r;
              d_cnjg(&local_a8,&local_b8);
              local_b8.r = pdVar1->r * local_78 - local_80 * pdVar1->i;
              local_b8.i = pdVar1->r * local_80 + pdVar1->i * local_78;
              dVar22 = local_60[lVar15].r;
              dVar2 = local_60[lVar15].i;
              dVar23 = (dVar22 * local_a8.r - local_a8.i * dVar2) + local_b8.r;
              iVar14 = *lda;
              iVar16 = (int)lVar15 * (iVar14 + 1);
              a[iVar16].r = dVar23 + a[iVar16].r;
              a[iVar16].i = 0.0;
              uVar5 = *local_68;
              n = (integer *)local_68;
              y = local_60;
              dVar22 = dVar22 * local_a8.i + dVar2 * local_a8.r + local_b8.i;
              if (lVar20 < (int)uVar5) {
                lVar12 = iVar14 * lVar10;
                lVar15 = lVar11;
                do {
                  dVar22 = *(double *)((long)&local_90->r + lVar15);
                  dVar2 = *(double *)((long)&local_90->i + lVar15);
                  local_b8.r = (dVar22 * local_78 - local_80 * dVar2) +
                               *(double *)((long)local_88 + lVar15 + lVar12 + -8);
                  local_b8.i = dVar22 * local_80 + dVar2 * local_78 +
                               *(double *)((long)local_88 + lVar15 + lVar12);
                  dVar22 = *(double *)((long)&local_60->r + lVar15);
                  dVar2 = *(double *)((long)&local_60->i + lVar15);
                  dVar23 = (dVar22 * local_a8.r - local_a8.i * dVar2) + local_b8.r;
                  dVar22 = dVar22 * local_a8.i + dVar2 * local_a8.r + local_b8.i;
                  *(double *)((long)local_88 + lVar15 + lVar12 + -8) = dVar23;
                  *(double *)((long)local_88 + lVar15 + lVar12) = dVar22;
                  lVar15 = lVar15 + 0x10;
                } while ((ulong)uVar5 << 4 != lVar15);
              }
            }
            else {
              a[(int)lVar15 * (*lda + 1)].i = 0.0;
              dVar23 = local_a8.r;
              dVar22 = local_a8.i;
            }
            local_a8.i = dVar22;
            local_a8.r = dVar23;
            lVar10 = lVar10 + 0x10;
            lVar11 = lVar11 + 0x10;
            bVar9 = lVar20 < *n;
            lVar20 = lVar20 + 1;
          } while (bVar9);
        }
      }
      else if (0 < *n) {
        local_48 = &a->i;
        local_50 = &x[-1].i;
        local_58 = &y[-1].i;
        uVar19 = 1;
        iVar14 = 0;
        local_38 = incx;
        do {
          pdVar1 = local_90;
          lVar20 = (long)unaff_R14D;
          local_78 = (double)CONCAT44(local_78._4_4_,(int)uplo);
          lVar11 = (long)(int)uplo;
          iVar16 = (int)uVar19;
          if ((((local_90[lVar20 + -1].r != 0.0) || (NAN(local_90[lVar20 + -1].r))) ||
              (local_90[lVar20 + -1].i != 0.0)) || (NAN(local_90[lVar20 + -1].i))) {
LAB_00123bba:
            local_80 = (double)CONCAT44(local_80._4_4_,iVar14);
            d_cnjg(&local_b8,y + lVar11 + -1);
            dVar22 = local_70->r;
            dVar2 = local_70->i;
            local_a8.r = dVar22 * local_b8.r - local_b8.i * dVar2;
            local_a8.i = local_b8.i * dVar22 + local_b8.r * dVar2;
            local_b8.r = dVar22 * pdVar1[lVar20 + -1].r - pdVar1[lVar20 + -1].i * dVar2;
            local_b8.i = dVar22 * pdVar1[lVar20 + -1].i + dVar2 * pdVar1[lVar20 + -1].r;
            local_88 = (double *)local_a8.r;
            local_40 = local_a8.i;
            d_cnjg(&local_a8,&local_b8);
            local_b8.r = pdVar1[lVar20 + -1].r * (double)local_88 - local_40 * pdVar1[lVar20 + -1].i
            ;
            local_b8.i = pdVar1[lVar20 + -1].r * local_40 + pdVar1[lVar20 + -1].i * (double)local_88
            ;
            dVar22 = y[lVar11 + -1].r;
            dVar2 = y[lVar11 + -1].i;
            dVar23 = (dVar22 * local_a8.r - local_a8.i * dVar2) + local_b8.r;
            iVar6 = *lda;
            iVar14 = (iVar6 + 1) * (iVar16 + -1);
            a[iVar14].r = dVar23 + a[iVar14].r;
            a[iVar14].i = 0.0;
            uVar13 = (ulong)*local_68;
            n = (integer *)local_68;
            y = local_60;
            iVar14 = local_80._0_4_;
            dVar22 = dVar22 * local_a8.i + dVar2 * local_a8.r + local_b8.i;
            if (iVar16 < (int)*local_68) {
              iVar7 = *local_38;
              iVar8 = *incy;
              pdVar18 = local_48 + ((long)(iVar6 * local_80._0_4_) + uVar19) * 2;
              pdVar17 = local_50 + (lVar20 + iVar7) * 2;
              pdVar21 = local_58 + (lVar11 + iVar8) * 2;
              do {
                local_b8.r = (((doublecomplex *)(pdVar17 + -1))->r * (double)local_88 -
                             local_40 * *pdVar17) + ((doublecomplex *)(pdVar18 + -1))->r;
                local_b8.i = ((doublecomplex *)(pdVar17 + -1))->r * local_40 +
                             *pdVar17 * (double)local_88 + *pdVar18;
                dVar23 = (((doublecomplex *)(pdVar21 + -1))->r * local_a8.r - local_a8.i * *pdVar21)
                         + local_b8.r;
                dVar22 = ((doublecomplex *)(pdVar21 + -1))->r * local_a8.i + *pdVar21 * local_a8.r +
                         local_b8.i;
                ((doublecomplex *)(pdVar18 + -1))->r = dVar23;
                *pdVar18 = dVar22;
                pdVar18 = pdVar18 + 2;
                uVar13 = uVar13 - 1;
                pdVar17 = pdVar17 + (long)iVar7 * 2;
                pdVar21 = pdVar21 + (long)iVar8 * 2;
              } while (uVar19 != uVar13);
            }
          }
          else {
            if (((y[lVar11 + -1].r != 0.0) || (NAN(y[lVar11 + -1].r))) ||
               ((y[lVar11 + -1].i != 0.0 || (NAN(y[lVar11 + -1].i))))) goto LAB_00123bba;
            a[(*lda + 1) * (iVar16 + -1)].i = 0.0;
            dVar23 = local_a8.r;
            dVar22 = local_a8.i;
          }
          local_a8.i = dVar22;
          local_a8.r = dVar23;
          unaff_R14D = unaff_R14D + *local_38;
          uplo = (char *)(ulong)(uint)(local_78._0_4_ + *incy);
          uVar19 = uVar19 + 1;
          iVar14 = iVar14 + 1;
        } while (iVar16 < *n);
      }
    }
  }
  else {
    input_error("ZHER2 ",&local_94);
  }
  return 0;
}

Assistant:

int zher2_(char *uplo, integer *n, doublecomplex *alpha, 
	doublecomplex *x, integer *incx, doublecomplex *y, integer *incy, 
	doublecomplex *a, integer *lda)
{


    /* System generated locals */

    doublereal d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp1, temp2;
    integer i, j;
    integer ix, iy, jx, jy, kx, ky;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZHER2  performs the hermitian rank 2 operation   

       A := alpha*x*conjg( y' ) + conjg( alpha )*y*conjg( x' ) + A,   

    where alpha is a scalar, x and y are n element vectors and A is an n 
  
    by n hermitian matrix.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the upper or lower   
             triangular part of the array A is to be referenced as   
             follows:   

                UPLO = 'U' or 'u'   Only the upper triangular part of A   
                                    is to be referenced.   

                UPLO = 'L' or 'l'   Only the lower triangular part of A   
                                    is to be referenced.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCY ) ).   
             Before entry, the incremented array Y must contain the n   
             element vector y.   
             Unchanged on exit.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular part of the hermitian matrix and the strictly   
             lower triangular part of A is not referenced. On exit, the   
             upper triangular part of the array A is overwritten by the   
             upper triangular part of the updated matrix.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular part of the hermitian matrix and the strictly   
             upper triangular part of A is not referenced. On exit, the   
             lower triangular part of the array A is overwritten by the   
             lower triangular part of the updated matrix.   
             Note that the imaginary parts of the diagonal elements need 
  
             not be set, they are assumed to be zero, and on exit they   
             are set to zero.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if (*n < 0) {
	info = 2;
    } else if (*incx == 0) {
	info = 5;
    } else if (*incy == 0) {
	info = 7;
    } else if (*lda < max(1,*n)) {
	info = 9;
    }
    if (info != 0) {
	input_error("ZHER2 ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || (alpha->r == 0. && alpha->i == 0.)) {
	return 0;
    }

/*     Set up the start points in X and Y if the increments are not both 
  
       unity. */

    if (*incx != 1 || *incy != 1) {
	if (*incx > 0) {
	    kx = 1;
	} else {
	    kx = 1 - (*n - 1) * *incx;
	}
	if (*incy > 0) {
	    ky = 1;
	} else {
	    ky = 1 - (*n - 1) * *incy;
	}
	jx = kx;
	jy = ky;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through the triangular part   
       of A. */

    if (strncmp(uplo, "U", 1)==0) {

/*        Form  A  when A is stored in the upper triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L10: */
		    }
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L20: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    ix = kx;
		    iy = ky;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
			ix += *incx;
			iy += *incy;
/* L30: */
		    }
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L40: */
	    }
	}
    } else {

/*        Form  A  when A is stored in the lower triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    for (i = j + 1; i <= *n; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L50: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    ix = jx;
		    iy = jy;
		    for (i = j + 1; i <= *n; ++i) {
			ix += *incx;
			iy += *incy;
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L70: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L80: */
	    }
	}
    }

    return 0;

/*     End of ZHER2 . */

}